

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-ping-pongs.c
# Opt level: O1

void buf_alloc(uv_handle_t *handle,size_t suggested_size,uv_buf_t *buf)

{
  char *pcVar1;
  
  pcVar1 = (char *)malloc(suggested_size);
  buf->base = pcVar1;
  buf->len = suggested_size;
  return;
}

Assistant:

static void buf_alloc(uv_handle_t* tcp, size_t size, uv_buf_t* buf) {
  buf_t* ab;

  ab = buf_freelist;
  if (ab != NULL)
    buf_freelist = ab->next;
  else {
    ab = malloc(size + sizeof(*ab));
    ab->uv_buf_t.len = size;
    ab->uv_buf_t.base = (char*) (ab + 1);
  }

  *buf = ab->uv_buf_t;
}